

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2ExternalSubset(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  xmlDtdPtr pxVar8;
  void *pvVar9;
  xmlChar *pxVar10;
  xmlParserInputPtr input_00;
  ulong uVar11;
  int inputMax;
  size_t buffered;
  unsigned_long consumed;
  xmlChar *oldencoding;
  xmlParserInputPtr input;
  xmlParserInputPtr *oldinputTab;
  int oldinputMax;
  int oldinputNr;
  xmlParserInputPtr oldinput;
  xmlParserCtxtPtr ctxt;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  void *ctx_local;
  
  if (((((ctx != (void *)0x0) && (SystemID != (xmlChar *)0x0)) &&
       ((*(uint *)((long)ctx + 0x234) & 0x800000) == 0)) &&
      ((*(int *)((long)ctx + 0x9c) != 0 || (*(int *)((long)ctx + 0x1b0) != 0)))) &&
     ((*(int *)((long)ctx + 0x18) != 0 && (*(long *)((long)ctx + 0x10) != 0)))) {
    oldencoding = (xmlChar *)0x0;
    if ((*ctx != 0) && (*(long *)(*ctx + 0x20) != 0)) {
      oldencoding = (xmlChar *)
                    (**(code **)(*ctx + 0x20))(*(undefined8 *)((long)ctx + 8),ExternalID,SystemID);
    }
    if (oldencoding != (xmlChar *)0x0) {
      pxVar8 = xmlNewDtd(*(xmlDocPtr *)((long)ctx + 0x10),name,ExternalID,SystemID);
      if (pxVar8 == (xmlDtdPtr)0x0) {
        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx);
        xmlFreeInputStream((xmlParserInputPtr)oldencoding);
      }
      else {
        uVar3 = *(undefined8 *)((long)ctx + 0x38);
        uVar1 = *(undefined4 *)((long)ctx + 0x40);
        uVar2 = *(undefined4 *)((long)ctx + 0x44);
        uVar4 = *(undefined8 *)((long)ctx + 0x48);
        uVar5 = *(undefined8 *)((long)ctx + 0x28);
        *(undefined8 *)((long)ctx + 0x28) = 0;
        pvVar9 = (*xmlMalloc)(0x28);
        *(void **)((long)ctx + 0x48) = pvVar9;
        if (*(long *)((long)ctx + 0x48) == 0) {
          xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx);
        }
        else {
          *(undefined4 *)((long)ctx + 0x40) = 0;
          *(undefined4 *)((long)ctx + 0x44) = 5;
          *(undefined8 *)((long)ctx + 0x38) = 0;
          iVar7 = xmlCtxtPushInput((xmlParserCtxtPtr)ctx,(xmlParserInputPtr)oldencoding);
          if (-1 < iVar7) {
            if (*(long *)(oldencoding + 8) == 0) {
              pxVar10 = xmlCanonicPath(SystemID);
              *(xmlChar **)(oldencoding + 8) = pxVar10;
            }
            oldencoding[0x34] = '\x01';
            oldencoding[0x35] = '\0';
            oldencoding[0x36] = '\0';
            oldencoding[0x37] = '\0';
            oldencoding[0x38] = '\x01';
            oldencoding[0x39] = '\0';
            oldencoding[0x3a] = '\0';
            oldencoding[0x3b] = '\0';
            *(undefined8 *)(oldencoding + 0x18) =
                 *(undefined8 *)(*(long *)((long)ctx + 0x38) + 0x20);
            *(undefined8 *)(oldencoding + 0x20) =
                 *(undefined8 *)(*(long *)((long)ctx + 0x38) + 0x20);
            oldencoding[0x48] = '\0';
            oldencoding[0x49] = '\0';
            oldencoding[0x4a] = '\0';
            oldencoding[0x4b] = '\0';
            oldencoding[0x4c] = '\0';
            oldencoding[0x4d] = '\0';
            oldencoding[0x4e] = '\0';
            oldencoding[0x4f] = '\0';
            xmlParseExternalSubset((xmlParserCtxtPtr)ctx,ExternalID,SystemID);
            while (1 < *(int *)((long)ctx + 0x40)) {
              input_00 = xmlCtxtPopInput((xmlParserCtxtPtr)ctx);
              xmlFreeInputStream(input_00);
            }
            lVar6 = *(long *)(*(long *)((long)ctx + 0x38) + 0x40);
            uVar11 = *(long *)(*(long *)((long)ctx + 0x38) + 0x20) -
                     *(long *)(*(long *)((long)ctx + 0x38) + 0x18);
            if (-lVar6 - 1U < uVar11) {
              buffered = 0xffffffffffffffff;
            }
            else {
              buffered = uVar11 + lVar6;
            }
            if (-*(long *)((long)ctx + 0x2c0) - 1U < buffered) {
              *(undefined8 *)((long)ctx + 0x2c0) = 0xffffffffffffffff;
            }
            else {
              *(size_t *)((long)ctx + 0x2c0) = buffered + *(long *)((long)ctx + 0x2c0);
            }
          }
        }
        xmlFreeInputStream((xmlParserInputPtr)oldencoding);
        (*xmlFree)(*(void **)((long)ctx + 0x48));
        *(undefined8 *)((long)ctx + 0x38) = uVar3;
        *(undefined4 *)((long)ctx + 0x40) = uVar1;
        *(undefined4 *)((long)ctx + 0x44) = uVar2;
        *(undefined8 *)((long)ctx + 0x48) = uVar4;
        if ((*(long *)((long)ctx + 0x28) != 0) &&
           ((*(long *)((long)ctx + 0x1c8) == 0 ||
            (iVar7 = xmlDictOwns(*(xmlDictPtr *)((long)ctx + 0x1c8),*(xmlChar **)((long)ctx + 0x28))
            , iVar7 == 0)))) {
          (*xmlFree)(*(void **)((long)ctx + 0x28));
        }
        *(undefined8 *)((long)ctx + 0x28) = uVar5;
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2ExternalSubset(void *ctx, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    if (ctx == NULL) return;
    if ((SystemID != NULL) &&
        ((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
        (((ctxt->validate) || (ctxt->loadsubset)) &&
	 (ctxt->wellFormed && ctxt->myDoc))) {
	/*
	 * Try to fetch and parse the external subset.
	 */
	xmlParserInputPtr oldinput;
	int oldinputNr;
	int oldinputMax;
	xmlParserInputPtr *oldinputTab;
	xmlParserInputPtr input = NULL;
	const xmlChar *oldencoding;
        unsigned long consumed;
        size_t buffered;
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        int inputMax = 1;
#else
        int inputMax = 5;
#endif

	/*
	 * Ask the Entity resolver to load the damn thing
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	    input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                        SystemID);
	if (input == NULL) {
	    return;
	}

	if (xmlNewDtd(ctxt->myDoc, name, ExternalID, SystemID) == NULL) {
            xmlSAX2ErrMemory(ctxt);
            xmlFreeInputStream(input);
            return;
        }

	/*
	 * make sure we won't destroy the main document context
	 */
	oldinput = ctxt->input;
	oldinputNr = ctxt->inputNr;
	oldinputMax = ctxt->inputMax;
	oldinputTab = ctxt->inputTab;
	oldencoding = ctxt->encoding;
	ctxt->encoding = NULL;

	ctxt->inputTab = xmlMalloc(inputMax * sizeof(xmlParserInputPtr));
	if (ctxt->inputTab == NULL) {
	    xmlSAX2ErrMemory(ctxt);
            goto error;
	}
	ctxt->inputNr = 0;
	ctxt->inputMax = inputMax;
	ctxt->input = NULL;
	if (xmlCtxtPushInput(ctxt, input) < 0)
            goto error;

	if (input->filename == NULL)
	    input->filename = (char *) xmlCanonicPath(SystemID);
	input->line = 1;
	input->col = 1;
	input->base = ctxt->input->cur;
	input->cur = ctxt->input->cur;
	input->free = NULL;

	/*
	 * let's parse that entity knowing it's an external subset.
	 */
	xmlParseExternalSubset(ctxt, ExternalID, SystemID);

        /*
	 * Free up the external entities
	 */

	while (ctxt->inputNr > 1)
	    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

        consumed = ctxt->input->consumed;
        buffered = ctxt->input->cur - ctxt->input->base;
        if (buffered > ULONG_MAX - consumed)
            consumed = ULONG_MAX;
        else
            consumed += buffered;
        if (consumed > ULONG_MAX - ctxt->sizeentities)
            ctxt->sizeentities = ULONG_MAX;
        else
            ctxt->sizeentities += consumed;

error:
	xmlFreeInputStream(input);
        xmlFree(ctxt->inputTab);

	/*
	 * Restore the parsing context of the main entity
	 */
	ctxt->input = oldinput;
	ctxt->inputNr = oldinputNr;
	ctxt->inputMax = oldinputMax;
	ctxt->inputTab = oldinputTab;
	if ((ctxt->encoding != NULL) &&
	    ((ctxt->dict == NULL) ||
	     (!xmlDictOwns(ctxt->dict, ctxt->encoding))))
	    xmlFree((xmlChar *) ctxt->encoding);
	ctxt->encoding = oldencoding;
	/* ctxt->wellFormed = oldwellFormed; */
    }
}